

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

int OpenMD::SquareMatrix<double,_3>::jacobi
              (SquareMatrix<double,_3> *a,Vector<double,_3U> *w,SquareMatrix<double,_3> *v)

{
  double *pdVar1;
  undefined8 uVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  double (*padVar13) [3];
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double zspace [10];
  double bspace [10];
  
  padVar13 = (double (*) [3])v;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      ((RectMatrix<double,_3U,_3U> *)*padVar13)->data_[0][lVar11] = 0.0;
    }
    *(undefined8 *)((long)(v->super_RectMatrix<double,_3U,_3U>).data_ + lVar3 * 0x20) =
         0x3ff0000000000000;
    padVar13 = padVar13 + 1;
  }
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    uVar2 = *(undefined8 *)((long)(a->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar3 * 4);
    *(undefined8 *)((long)w->data_ + lVar3) = uVar2;
    *(undefined8 *)((long)bspace + lVar3) = uVar2;
    *(undefined8 *)((long)zspace + lVar3) = 0;
  }
  uVar8 = 0;
  uVar7 = 1;
  do {
    if (uVar8 == 0x14) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "SquareMatrix::Jacobi: Error extracting eigenfunctions");
      std::endl<char,std::char_traits<char>>(poVar6);
      return 0;
    }
    dVar18 = 0.0;
    pdVar4 = (double *)a;
    for (lVar3 = 0; uVar5 = uVar7, lVar3 != 2; lVar3 = lVar3 + 1) {
      for (; lVar3 + uVar5 != 3; uVar5 = uVar5 + 1) {
        dVar18 = dVar18 + ABS(pdVar4[uVar5]);
      }
      pdVar4 = pdVar4 + 4;
    }
    if ((dVar18 == 0.0) && (!NAN(dVar18))) {
      uVar7 = 1;
      pdVar4 = (double *)v;
      for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
        uVar9 = uVar5 & 0xffffffff;
        dVar18 = w->data_[uVar5];
        for (uVar12 = uVar7; uVar12 != 3; uVar12 = uVar12 + 1) {
          dVar21 = w->data_[uVar12];
          if (dVar18 <= dVar21) {
            uVar9 = uVar12 & 0xffffffff;
          }
          dVar18 = (double)(-(ulong)(dVar21 < dVar18) & (ulong)dVar18 |
                           ~-(ulong)(dVar21 < dVar18) & (ulong)dVar21);
        }
        if (uVar5 != uVar9) {
          w->data_[uVar9] = w->data_[uVar5];
          w->data_[uVar5] = dVar18;
          for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
            uVar2 = *(undefined8 *)((long)pdVar4 + lVar3);
            *(undefined8 *)((long)pdVar4 + lVar3) =
                 *(undefined8 *)
                  ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar3 + uVar9 * 8);
            *(undefined8 *)
             ((long)(v->super_RectMatrix<double,_3U,_3U>).data_[0] + lVar3 + uVar9 * 8) = uVar2;
          }
        }
        uVar7 = uVar7 + 1;
        pdVar4 = pdVar4 + 1;
      }
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        uVar8 = 0;
        for (lVar11 = 0; lVar11 != 0x48; lVar11 = lVar11 + 0x18) {
          uVar8 = (uVar8 + 1) - (uint)(*(double *)((long)v + lVar11) < 0.0);
        }
        if (uVar8 < 2) {
          for (lVar11 = 0; lVar11 != 0x48; lVar11 = lVar11 + 0x18) {
            *(ulong *)((long)v + lVar11) = *(ulong *)((long)v + lVar11) ^ 0x8000000000000000;
          }
        }
        v = (SquareMatrix<double,_3> *)((long)v + 8);
      }
      return 1;
    }
    dVar18 = (dVar18 * 0.2) / 9.0;
    if (2 < uVar8) {
      dVar18 = 0.0;
    }
    pdVar16 = (double *)v;
    uVar12 = 0;
    pdVar4 = (v->super_RectMatrix<double,_3U,_3U>).data_[0];
    while (pdVar4 = pdVar4 + 1, uVar12 != 2) {
      pdVar17 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar12] + 1;
      pdVar10 = pdVar4;
      for (uVar9 = uVar5; uVar9 != 3; uVar9 = uVar9 + 1) {
        pdVar1 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar12] + uVar9;
        dVar21 = *pdVar1;
        dVar19 = ABS(dVar21) * 100.0;
        if (uVar8 < 4) {
LAB_001d7e0c:
          if (dVar18 < ABS(dVar21)) {
            dVar22 = w->data_[uVar12];
            dVar20 = w->data_[uVar9] - dVar22;
            dVar23 = ABS(dVar20);
            if ((dVar19 + dVar23 != dVar23) || (NAN(dVar19 + dVar23) || NAN(dVar23))) {
              dVar19 = (dVar20 * 0.5) / dVar21;
              dVar20 = 1.0 / (SQRT(dVar19 * dVar19 + 1.0) + ABS(dVar19));
              if (dVar19 < 0.0) {
                dVar20 = -dVar20;
              }
            }
            else {
              dVar20 = dVar21 / dVar20;
            }
            dVar23 = 1.0 / SQRT(dVar20 * dVar20 + 1.0);
            dVar19 = dVar20 * dVar23;
            dVar21 = dVar21 * dVar20;
            zspace[uVar12] = zspace[uVar12] - dVar21;
            zspace[uVar9] = zspace[uVar9] + dVar21;
            w->data_[uVar12] = dVar22 - dVar21;
            w->data_[uVar9] = dVar21 + w->data_[uVar9];
            *pdVar1 = 0.0;
            dVar21 = dVar19 / (dVar23 + 1.0);
            dVar22 = -dVar19;
            uVar14 = 0;
            while (uVar15 = uVar12 + 1, uVar14 < uVar12) {
              dVar20 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar12];
              dVar23 = (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar9];
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar12] =
                   (dVar20 * dVar21 + dVar23) * dVar22 + dVar20;
              (a->super_RectMatrix<double,_3U,_3U>).data_[0][uVar9] =
                   (dVar20 - dVar23 * dVar21) * dVar19 + dVar23;
              uVar14 = uVar7;
            }
            while (uVar15 < uVar9) {
              dVar20 = *pdVar17;
              dVar23 = (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar9];
              *pdVar17 = (dVar20 * dVar21 + dVar23) * dVar22 + dVar20;
              (a->super_RectMatrix<double,_3U,_3U>).data_[1][uVar9] =
                   (dVar20 - dVar23 * dVar21) * dVar19 + dVar23;
              uVar15 = 2;
            }
            if (uVar9 != 2) {
              dVar20 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar12][2];
              dVar23 = (a->super_RectMatrix<double,_3U,_3U>).data_[uVar9][2];
              (a->super_RectMatrix<double,_3U,_3U>).data_[uVar12][2] =
                   (dVar20 * dVar21 + dVar23) * dVar22 + dVar20;
              (a->super_RectMatrix<double,_3U,_3U>).data_[uVar9][2] =
                   (dVar20 - dVar23 * dVar21) * dVar19 + dVar23;
            }
            for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
              dVar20 = *(double *)((long)pdVar16 + lVar3);
              dVar23 = *(double *)((long)pdVar10 + lVar3);
              *(double *)((long)pdVar16 + lVar3) = (dVar20 * dVar21 + dVar23) * dVar22 + dVar20;
              *(double *)((long)pdVar10 + lVar3) = (dVar20 - dVar23 * dVar21) * dVar19 + dVar23;
            }
          }
        }
        else {
          dVar22 = ABS(w->data_[uVar12]);
          if ((dVar19 + dVar22 != dVar22) || (NAN(dVar19 + dVar22) || NAN(dVar22)))
          goto LAB_001d7e0c;
          dVar22 = ABS(w->data_[uVar9]);
          if ((dVar19 + dVar22 != dVar22) || (NAN(dVar19 + dVar22) || NAN(dVar22)))
          goto LAB_001d7e0c;
          *pdVar1 = 0.0;
        }
        pdVar10 = pdVar10 + 1;
      }
      uVar5 = uVar5 + 1;
      pdVar16 = pdVar16 + 1;
      uVar12 = uVar12 + 1;
    }
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar18 = bspace[lVar3];
      bspace[lVar3] = zspace[lVar3] + dVar18;
      w->data_[lVar3] = zspace[lVar3] + dVar18;
      zspace[lVar3] = 0.0;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int SquareMatrix<Real, Dim>::jacobi(SquareMatrix<Real, Dim>& a,
                                      Vector<Real, Dim>& w,
                                      SquareMatrix<Real, Dim>& v) {
    const int n = Dim;
    int i, j, k, iq, ip, numPos;
    Real tresh, theta, tau, t, sm, s, h, g, c, tmp;
    Real bspace[MAX_SCRATCH_ARRAY_SIZE], zspace[MAX_SCRATCH_ARRAY_SIZE];
    Real* b = (n <= MAX_SCRATCH_ARRAY_SIZE) ? bspace : new Real[n];
    Real* z = (n <= MAX_SCRATCH_ARRAY_SIZE) ? zspace : new Real[n];

    // initialize
    for (ip = 0; ip < n; ip++) {
      for (iq = 0; iq < n; iq++) {
        v(ip, iq) = 0.0;
      }
      v(ip, ip) = 1.0;
    }
    for (ip = 0; ip < n; ip++) {
      b[ip] = w[ip] = a(ip, ip);
      z[ip]         = 0.0;
    }

    // begin rotation sequence
    for (i = 0; i < MAX_ROTATIONS; ++i) {
      sm = 0.0;
      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          sm += std::abs(a(ip, iq));
        }
      }
      if (sm == 0.0) { break; }

      if (i < 3) {  // first 3 sweeps
        tresh = 0.2 * sm / (n * n);
      } else {
        tresh = 0.0;
      }

      for (ip = 0; ip < n - 1; ip++) {
        for (iq = ip + 1; iq < n; iq++) {
          g = 100.0 * std::abs(a(ip, iq));

          // after 4 sweeps
          if (i > 3 && (std::abs(w[ip]) + g) == std::abs(w[ip]) &&
              (std::abs(w[iq]) + g) == std::abs(w[iq])) {
            a(ip, iq) = 0.0;
          } else if (std::abs(a(ip, iq)) > tresh) {
            h = w[iq] - w[ip];
            if ((std::abs(h) + g) == std::abs(h)) {
              t = (a(ip, iq)) / h;
            } else {
              theta = 0.5 * h / (a(ip, iq));
              t     = 1.0 / (std::abs(theta) + std::sqrt(1.0 + theta * theta));
              if (theta < 0.0) { t = -t; }
            }
            c   = 1.0 / std::sqrt(1 + t * t);
            s   = t * c;
            tau = s / (1.0 + c);
            h   = t * a(ip, iq);
            z[ip] -= h;
            z[iq] += h;
            w[ip] -= h;
            w[iq] += h;
            a(ip, iq) = 0.0;

            // ip already shifted left by 1 unit
            for (j = 0; j <= ip - 1; ++j) {
              ROTATE(a, j, ip, j, iq);
            }
            // ip and iq already shifted left by 1 unit
            for (j = ip + 1; j <= iq - 1; ++j) {
              ROTATE(a, ip, j, j, iq);
            }
            // iq already shifted left by 1 unit
            for (j = iq + 1; j < n; ++j) {
              ROTATE(a, ip, j, iq, j);
            }
            for (j = 0; j < n; ++j) {
              ROTATE(v, j, ip, j, iq);
            }
          }
        }
      }

      for (ip = 0; ip < n; ip++) {
        b[ip] += z[ip];
        w[ip] = b[ip];
        z[ip] = 0.0;
      }
    }

    //// this is NEVER called
    if (i >= MAX_ROTATIONS) {
      std::cout << "SquareMatrix::Jacobi: Error extracting eigenfunctions"
                << std::endl;
      if (n > MAX_SCRATCH_ARRAY_SIZE) {
        delete[] b;
        delete[] z;
      }
      return 0;
    }

    // sort eigenfunctions             these changes do not affect accuracy
    for (j = 0; j < n - 1; ++j) {  // boundary incorrect
      k   = j;
      tmp = w[k];
      for (i = j + 1; i < n; ++i) {  // boundary incorrect, shifted already
        if (w[i] >= tmp) {           // why exchage if same?
          k   = i;
          tmp = w[k];
        }
      }
      if (k != j) {
        w[k] = w[j];
        w[j] = tmp;
        for (i = 0; i < n; i++) {
          tmp     = v(i, j);
          v(i, j) = v(i, k);
          v(i, k) = tmp;
        }
      }
    }
    // insure eigenvector consistency (i.e., Jacobi can compute
    // vectors that are negative of one another (.707,.707,0) and
    // (-.707,-.707,0). This can wreak havoc in other stuff. We will
    // select the most positive eigenvector.
    int ceil_half_n = (n >> 1) + (n & 1);
    for (j = 0; j < n; ++j) {
      for (numPos = 0, i = 0; i < n; ++i) {
        if (v(i, j) >= 0.0) { numPos++; }
      }
      if (numPos < ceil_half_n) {
        for (i = 0; i < n; ++i) {
          v(i, j) *= -1.0;
        }
      }
    }

    if (n > MAX_SCRATCH_ARRAY_SIZE) {
      delete[] b;
      delete[] z;
    }
    return 1;
  }